

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O2

int snap_sunk_store2(GCtrace *T,IRIns *ira,IRIns *irs)

{
  IRIns *pIVar1;
  uint uVar2;
  uint uVar3;
  IRIns *pIVar4;
  
  uVar2 = 0;
  uVar3 = (irs->field_1).o - 0x4a;
  if ((uVar3 < 5) && (uVar3 != 2)) {
    pIVar1 = T->ir;
    pIVar4 = pIVar1 + (irs->field_0).op1;
    if (((pIVar4->field_1).o & 0xfe) == 0x38) {
      pIVar4 = pIVar1 + (pIVar4->field_0).op1;
    }
    uVar2 = (uint)(pIVar1 + (pIVar4->field_0).op1 == ira);
  }
  return uVar2;
}

Assistant:

static int snap_sunk_store2(GCtrace *T, IRIns *ira, IRIns *irs)
{
  if (irs->o == IR_ASTORE || irs->o == IR_HSTORE ||
      irs->o == IR_FSTORE || irs->o == IR_XSTORE) {
    IRIns *irk = &T->ir[irs->op1];
    if (irk->o == IR_AREF || irk->o == IR_HREFK)
      irk = &T->ir[irk->op1];
    return (&T->ir[irk->op1] == ira);
  }
  return 0;
}